

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt__ray_intersect_bezier
              (float *orig,float *ray,float *q0,float *q1,float *q2,float (*hits) [2])

{
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float *in_R8;
  float *in_R9;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float q0rd;
  float q20d;
  float q10d;
  float rod;
  float q2d;
  float q1d;
  float q0d;
  float rayn_y;
  float rayn_x;
  float rcp_len2;
  float d;
  float rcpna;
  float discr;
  int num_s;
  float s1;
  float s0;
  float c;
  float b;
  float a;
  float roperp;
  float q2perp;
  float q1perp;
  float q0perp;
  uint local_60;
  float local_5c;
  float local_58;
  int local_4;
  
  fVar1 = in_RDX[1] * *in_RSI + -(*in_RDX * in_RSI[1]);
  fVar2 = in_RCX[1] * *in_RSI + -(*in_RCX * in_RSI[1]);
  fVar3 = (fVar1 - (fVar2 + fVar2)) + in_R8[1] * *in_RSI + -(*in_R8 * in_RSI[1]);
  fVar2 = fVar2 - fVar1;
  fVar1 = fVar1 - (in_RDI[1] * *in_RSI + -(*in_RDI * in_RSI[1]));
  local_58 = 0.0;
  local_5c = 0.0;
  local_60 = 0;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar1 = fVar2 * fVar2 + -(fVar3 * fVar1);
    if (0.0 < fVar1) {
      dVar8 = sqrt((double)fVar1);
      fVar1 = (float)dVar8;
      local_58 = (fVar2 + fVar1) * (-1.0 / fVar3);
      local_5c = (fVar2 - fVar1) * (-1.0 / fVar3);
      if ((0.0 <= local_58) && (local_58 <= 1.0)) {
        local_60 = 1;
      }
      if (((0.0 < fVar1) && (0.0 <= local_5c)) && (local_5c <= 1.0)) {
        if (local_60 == 0) {
          local_58 = local_5c;
        }
        local_60 = local_60 + 1;
      }
    }
  }
  else {
    local_58 = fVar1 / (fVar2 * -2.0);
    if ((0.0 <= local_58) && (local_58 <= 1.0)) {
      local_60 = 1;
    }
  }
  if (local_60 == 0) {
    local_4 = 0;
  }
  else {
    fVar4 = 1.0 / (*in_RSI * *in_RSI + in_RSI[1] * in_RSI[1]);
    fVar1 = *in_RSI * fVar4;
    fVar4 = in_RSI[1] * fVar4;
    fVar5 = *in_RDX * fVar1 + in_RDX[1] * fVar4;
    fVar6 = (*in_RCX * fVar1 + in_RCX[1] * fVar4) - fVar5;
    fVar7 = (*in_R8 * fVar1 + in_R8[1] * fVar4) - fVar5;
    fVar5 = fVar5 - (*in_RDI * fVar1 + in_RDI[1] * fVar4);
    *in_R9 = local_58 * local_58 * fVar7 + local_58 * (2.0 - (local_58 + local_58)) * fVar6 + fVar5;
    in_R9[1] = fVar3 * local_58 + fVar2;
    if (local_60 < 2) {
      local_4 = 1;
    }
    else {
      in_R9[2] = local_5c * local_5c * fVar7 +
                 local_5c * (2.0 - (local_5c + local_5c)) * fVar6 + fVar5;
      in_R9[3] = fVar3 * local_5c + fVar2;
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static int stbtt__ray_intersect_bezier(float orig[2], float ray[2], float q0[2], float q1[2], float q2[2], float hits[2][2])
{
float q0perp = q0[1]*ray[0] - q0[0]*ray[1];
float q1perp = q1[1]*ray[0] - q1[0]*ray[1];
float q2perp = q2[1]*ray[0] - q2[0]*ray[1];
float roperp = orig[1]*ray[0] - orig[0]*ray[1];

float a = q0perp - 2*q1perp + q2perp;
float b = q1perp - q0perp;
float c = q0perp - roperp;

float s0 = 0., s1 = 0.;
int num_s = 0;

if (a != 0.0) {
float discr = b*b - a*c;
if (discr > 0.0) {
float rcpna = -1 / a;
float d = (float) STBTT_sqrt(discr);
s0 = (b+d) * rcpna;
s1 = (b-d) * rcpna;
if (s0 >= 0.0 && s0 <= 1.0)
num_s = 1;
if (d > 0.0 && s1 >= 0.0 && s1 <= 1.0) {
if (num_s == 0) s0 = s1;
++num_s;
}
}
} else {
/*  2*b*s + c = 0 */
/*  s = -c / (2*b) */
s0 = c / (-2 * b);
if (s0 >= 0.0 && s0 <= 1.0)
num_s = 1;
}

if (num_s == 0)
return 0;
else {
float rcp_len2 = 1 / (ray[0]*ray[0] + ray[1]*ray[1]);
float rayn_x = ray[0] * rcp_len2, rayn_y = ray[1] * rcp_len2;

float q0d =   q0[0]*rayn_x +   q0[1]*rayn_y;
float q1d =   q1[0]*rayn_x +   q1[1]*rayn_y;
float q2d =   q2[0]*rayn_x +   q2[1]*rayn_y;
float rod = orig[0]*rayn_x + orig[1]*rayn_y;

float q10d = q1d - q0d;
float q20d = q2d - q0d;
float q0rd = q0d - rod;

hits[0][0] = q0rd + s0*(2.0f - 2.0f*s0)*q10d + s0*s0*q20d;
hits[0][1] = a*s0+b;

if (num_s > 1) {
hits[1][0] = q0rd + s1*(2.0f - 2.0f*s1)*q10d + s1*s1*q20d;
hits[1][1] = a*s1+b;
return 2;
} else {
return 1;
}
}
}